

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

roaring_bitmap_t * roaring_bitmap_create_with_capacity(uint32_t cap)

{
  _Bool _Var1;
  _Bool is_ok;
  roaring_bitmap_t *ans;
  uint32_t in_stack_ffffffffffffffe4;
  roaring_array_t *local_8;
  
  local_8 = (roaring_array_t *)roaring_malloc(0x131852);
  if (local_8 == (roaring_array_t *)0x0) {
    local_8 = (roaring_array_t *)0x0;
  }
  else {
    _Var1 = ra_init_with_capacity(local_8,in_stack_ffffffffffffffe4);
    if (!_Var1) {
      roaring_free((void *)0x13188f);
      local_8 = (roaring_array_t *)0x0;
    }
  }
  return (roaring_bitmap_t *)local_8;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_create_with_capacity(uint32_t cap) {
    roaring_bitmap_t *ans =
        (roaring_bitmap_t *)roaring_malloc(sizeof(roaring_bitmap_t));
    if (!ans) {
        return NULL;
    }
    bool is_ok = ra_init_with_capacity(&ans->high_low_container, cap);
    if (!is_ok) {
        roaring_free(ans);
        return NULL;
    }
    return ans;
}